

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O0

_Bool get_move_flee(monster_conflict *mon)

{
  _Bool _Var1;
  wchar_t wVar2;
  loc_conflict grid_00;
  wchar_t local_38;
  wchar_t wStack_34;
  loc grid;
  wchar_t score;
  wchar_t dis;
  wchar_t best_score;
  loc best;
  wchar_t i;
  monster_conflict *mon_local;
  
  _dis = (loc_conflict)loc(0,0);
  score = L'\xffffffff';
  _Var1 = monster_taking_terrain_damage((chunk *)cave,(monster *)mon);
  if (!_Var1) {
    if (mon->best_range <= mon->cdis) {
      return false;
    }
    _Var1 = monster_can_hear(mon);
    if ((!_Var1) && (_Var1 = monster_can_smell(mon), !_Var1)) {
      return false;
    }
  }
  for (best.x = 7; -1 < best.x; best.x = best.x + -1) {
    grid_00 = (loc_conflict)loc_sum(mon->grid,ddgrid_ddd[best.x]);
    _Var1 = square_in_bounds((chunk *)cave,grid_00);
    if (_Var1) {
      wVar2 = distance((loc)grid_00,(mon->target).grid);
      wStack_34 = grid_00.y;
      local_38 = grid_00.x;
      grid.x = (int)(5000 / (long)(wVar2 + L'\x03')) -
               (int)(500 / (ulong)(long)(int)((cave->noise).grids[wStack_34][local_38] + 1));
      if (grid.x < 0) {
        grid.x = 0;
      }
      if (score <= grid.x) {
        score = grid.x;
        _dis = grid_00;
      }
    }
  }
  (mon->target).grid.x = dis;
  (mon->target).grid.y = best_score;
  return true;
}

Assistant:

static bool get_move_flee(struct monster *mon)
{
	int i;
	struct loc best = loc(0, 0);
	int best_score = -1;

	/* Taking damage from terrain makes moving vital */
	if (!monster_taking_terrain_damage(cave, mon)) {
		/* If the player is not currently near the monster, no reason to flow */
		if (mon->cdis >= mon->best_range) {
			return false;
		}

		/* Monster is too far away to use sound or scent */
		if (!monster_can_hear(mon) && !monster_can_smell(mon)) {
			return false;
		}
	}

	/* Check nearby grids, diagonals first */
	for (i = 7; i >= 0; i--) {
		int dis, score;

		/* Get the location */
		struct loc grid = loc_sum(mon->grid, ddgrid_ddd[i]);

		/* Bounds check */
		if (!square_in_bounds(cave, grid)) continue;

		/* Calculate distance of this grid from our target */
		dis = distance(grid, mon->target.grid);

		/* Score this grid
		 * First half of calculation is inversely proportional to distance
		 * Second half is inversely proportional to grid's distance from player
		 */
		score = 5000 / (dis + 3) - 500 /(cave->noise.grids[grid.y][grid.x] + 1);

		/* No negative scores */
		if (score < 0) score = 0;

		/* Ignore lower scores */
		if (score < best_score) continue;

		/* Save the score */
		best_score = score;

		/* Save the location */
		best = grid;
	}

	/* Set the immediate target */
	mon->target.grid = best;

	/* Success */
	return true;
}